

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCharData(xmlParserCtxtPtr ctxt,int cdata)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  uchar uVar4;
  xmlType xVar5;
  xmlParserInputPtr pxVar6;
  _xmlSAXHandler *p_Var7;
  xmlChar *pxVar8;
  ignorableWhitespaceSAXFunc p_Var9;
  int iVar10;
  uint val;
  charactersSAXFunc UNRECOVERED_JUMPTABLE;
  bool bVar11;
  int iVar12;
  byte *pbVar13;
  uint len;
  int iVar14;
  byte *pbVar15;
  xmlChar buf [305];
  int local_170;
  int local_16c;
  xmlChar local_168 [312];
  
  pxVar6 = ctxt->input;
  iVar14 = pxVar6->line;
  iVar10 = pxVar6->col;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar6->cur - (long)pxVar6->base)) &&
     ((long)pxVar6->end - (long)pxVar6->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((cdata == 0) && (ctxt->mlType == XML_TYPE_XML)) {
    pbVar15 = ctxt->input->cur;
    do {
      while( true ) {
        while (bVar3 = *pbVar15, bVar3 == 10) {
          pxVar6 = ctxt->input;
          iVar12 = pxVar6->line;
          pbVar13 = pbVar15;
          do {
            iVar12 = iVar12 + 1;
            pxVar6->line = iVar12;
            pxVar6->col = 1;
            pbVar15 = pbVar13 + 1;
            pbVar2 = pbVar13 + 1;
            pbVar13 = pbVar15;
          } while (*pbVar2 == 10);
        }
        if (bVar3 != 0x20) break;
        pbVar15 = pbVar15 + 1;
        piVar1 = &ctxt->input->col;
        *piVar1 = *piVar1 + 1;
      }
      if (bVar3 == 0x3c) {
        pxVar8 = ctxt->input->cur;
        iVar14 = (int)pbVar15 - (int)pxVar8;
        if (iVar14 < 1) {
          return;
        }
        ctxt->input->cur = pbVar15;
        p_Var7 = ctxt->sax;
        if (p_Var7 != (_xmlSAXHandler *)0x0) {
          if (p_Var7->ignorableWhitespace == p_Var7->characters) {
            if (p_Var7 == (_xmlSAXHandler *)0x0) {
              return;
            }
            UNRECOVERED_JUMPTABLE = p_Var7->characters;
          }
          else {
            iVar10 = areBlanks(ctxt,pxVar8,iVar14,1);
            if (iVar10 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar8,iVar14);
              }
              if (*ctxt->space != -1) {
                return;
              }
              *ctxt->space = -2;
              return;
            }
            UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
          }
          if (UNRECOVERED_JUMPTABLE == (charactersSAXFunc)0x0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar8,iVar14);
          return;
        }
        return;
      }
      pxVar6 = ctxt->input;
      iVar12 = pxVar6->col;
      while( true ) {
        while( true ) {
          uVar4 = ""[*pbVar15];
          pbVar13 = pbVar15;
          while (uVar4 != '\0') {
            iVar12 = iVar12 + 1;
            pbVar15 = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
            uVar4 = ""[*pbVar15];
          }
          pxVar6->col = iVar12;
          local_16c = iVar14;
          if (*pbVar13 != 0x5d) break;
          pbVar15 = pbVar13 + 1;
          if ((pbVar13[1] == 0x5d) && (pbVar13[2] == 0x3e)) {
            xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
            ctxt->input->cur = pbVar15;
            return;
          }
          iVar12 = iVar12 + 1;
          pxVar6->col = iVar12;
        }
        if (*pbVar13 != 10) break;
        iVar12 = pxVar6->line;
        do {
          iVar12 = iVar12 + 1;
          pxVar6->line = iVar12;
          pxVar6->col = 1;
          pbVar15 = pbVar13 + 1;
          pbVar13 = pbVar13 + 1;
        } while (*pbVar15 == 10);
        iVar12 = 1;
        pbVar15 = pbVar13;
      }
      pbVar15 = pxVar6->cur;
      iVar14 = (int)pbVar13 - (int)pbVar15;
      if (0 < iVar14) {
        p_Var7 = ctxt->sax;
        if (p_Var7 != (_xmlSAXHandler *)0x0) {
          if (((p_Var7->ignorableWhitespace == p_Var7->characters) || (0x20 < (ulong)*pbVar15)) ||
             ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0)) {
            if (p_Var7 != (_xmlSAXHandler *)0x0) {
              UNRECOVERED_JUMPTABLE = p_Var7->characters;
              goto LAB_0015e9c0;
            }
          }
          else {
            pxVar6->cur = pbVar13;
            iVar10 = areBlanks(ctxt,pbVar15,iVar14,0);
            if (iVar10 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pbVar15,iVar14);
              }
              if (*ctxt->space == -1) {
                *ctxt->space = -2;
              }
            }
            else {
              UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
LAB_0015e9c0:
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pbVar15,iVar14);
              }
            }
            iVar10 = ctxt->input->col;
            local_16c = ctxt->input->line;
          }
        }
        if (ctxt->instate != XML_PARSER_CONTENT) {
          return;
        }
      }
      pxVar6 = ctxt->input;
      pxVar6->cur = pbVar13;
      bVar3 = *pbVar13;
      if ((bVar3 == 0xd) && (pbVar13[1] == 10)) {
        pxVar6->cur = pbVar13 + 1;
        pxVar6->line = pxVar6->line + 1;
        pbVar15 = pbVar13 + 2;
        pxVar6->col = 1;
      }
      else {
        if (bVar3 == 0x26) {
          return;
        }
        if (bVar3 == 0x3c) {
          return;
        }
        if (((ctxt->progressive == 0) && (500 < (long)pbVar13 - (long)pxVar6->base)) &&
           ((long)pxVar6->end - (long)pbVar13 < 500)) {
          xmlSHRINK(ctxt);
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return;
        }
        pbVar15 = ctxt->input->cur;
      }
      iVar14 = local_16c;
    } while ((byte)(*pbVar15 - 9) < 2 || '\x1f' < (char)*pbVar15);
  }
  pxVar6 = ctxt->input;
  pxVar6->line = iVar14;
  pxVar6->col = iVar10;
  if (((ctxt->progressive == 0) && (500 < (long)pxVar6->cur - (long)pxVar6->base)) &&
     ((long)pxVar6->end - (long)pxVar6->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  val = xmlCurrentChar(ctxt,&local_170);
  len = 0;
  iVar14 = 0;
  do {
    xVar5 = ctxt->mlType;
    if (val == 0x3c || xVar5 != XML_TYPE_XML) {
      if (xVar5 != XML_TYPE_SML) goto LAB_0015ee78;
      if (val != 0x22) {
        if ((val == 0x7d) && (ctxt->quoted == 0)) goto LAB_0015ee78;
        goto LAB_0015ebca;
      }
      if (ctxt->quoted != 0) goto LAB_0015ee78;
    }
    else {
LAB_0015ebca:
      if (val == 0x26) goto LAB_0015ee78;
    }
    if ((int)val < 0x100) {
      if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) {
        bVar11 = 0x1f < (int)val;
        goto LAB_0015ec30;
      }
    }
    else {
      bVar11 = (val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800;
LAB_0015ec30:
      if (!bVar11) goto LAB_0015ee78;
    }
    if ((xVar5 == XML_TYPE_SML) && (ctxt->quoted == 0)) {
      if ((ctxt->curly == 0) && ((val == 10 || (val == 0x3b)))) goto LAB_0015ee78;
      if (val == 0x20 || ctxt->curly == 0) goto LAB_0015ec74;
      if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_0015ee78;
    }
    else {
LAB_0015ec74:
      if ((((val == 0x5d) && (pxVar8 = ctxt->input->cur, pxVar8[1] == ']')) && (pxVar8[2] == '>'))
         && ((xVar5 != XML_TYPE_SML || (ctxt->quoted == 0)))) {
        if (cdata != 0) {
LAB_0015ee78:
          if (((len != 0) && (local_168[(int)len] = '\0', ctxt->sax != (_xmlSAXHandler *)0x0)) &&
             (ctxt->disableSAX == 0)) {
            iVar14 = areBlanks(ctxt,local_168,len,0);
            if (iVar14 == 0) {
              UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
              if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
                (*UNRECOVERED_JUMPTABLE)(ctxt->userData,local_168,len);
              }
              if ((ctxt->sax->characters != ctxt->sax->ignorableWhitespace) && (*ctxt->space == -1))
              {
                *ctxt->space = -2;
              }
            }
            else {
              p_Var9 = ctxt->sax->ignorableWhitespace;
              if (p_Var9 != (ignorableWhitespaceSAXFunc)0x0) {
                (*p_Var9)(ctxt->userData,local_168,len);
              }
            }
          }
          if (val != 0) {
            if ((int)val < 0x100) {
              if (0x1f < (int)val) {
                return;
              }
              if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
                return;
              }
            }
            else if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800) {
              return;
            }
            xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"PCDATA invalid Char value %d\n",val);
            pxVar6 = ctxt->input;
            if (*pxVar6->cur == '\n') {
              pxVar6->line = pxVar6->line + 1;
              pxVar6->col = 1;
            }
            else {
              pxVar6->col = pxVar6->col + 1;
            }
            pxVar6->cur = pxVar6->cur + local_170;
          }
          return;
        }
        xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
      }
    }
    if ((ctxt->mlType == XML_TYPE_SML) && ((val == 0x5c && (ctxt->quoted != 0)))) {
      pxVar6 = ctxt->input;
      if (*pxVar6->cur == '\n') {
        pxVar6->line = pxVar6->line + 1;
        pxVar6->col = 1;
      }
      else {
        pxVar6->col = pxVar6->col + 1;
      }
      iVar14 = iVar14 + 1;
      pxVar6->cur = pxVar6->cur + local_170;
      val = xmlCurrentChar(ctxt,&local_170);
    }
    if (local_170 == 1) {
      local_168[(int)len] = (xmlChar)val;
      len = len + 1;
    }
    else {
      iVar10 = xmlCopyCharMultiByte(local_168 + (int)len,val);
      len = len + iVar10;
    }
    if (299 < (int)len) {
      local_168[len] = '\0';
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
        iVar10 = areBlanks(ctxt,local_168,len,0);
        if (iVar10 == 0) {
          UNRECOVERED_JUMPTABLE = ctxt->sax->characters;
          if (UNRECOVERED_JUMPTABLE != (charactersSAXFunc)0x0) {
            (*UNRECOVERED_JUMPTABLE)(ctxt->userData,local_168,len);
          }
          if ((ctxt->sax->characters != ctxt->sax->ignorableWhitespace) && (*ctxt->space == -1)) {
            *ctxt->space = -2;
          }
        }
        else {
          p_Var9 = ctxt->sax->ignorableWhitespace;
          if (p_Var9 != (ignorableWhitespaceSAXFunc)0x0) {
            (*p_Var9)(ctxt->userData,local_168,len);
          }
        }
      }
      len = 0;
      if (ctxt->instate != XML_PARSER_CONTENT) {
        return;
      }
    }
    if (iVar14 < 0x32) {
      iVar14 = iVar14 + 1;
    }
    else {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar14 = 0;
      if (ctxt->instate == XML_PARSER_EOF) {
        return;
      }
    }
    pxVar6 = ctxt->input;
    if (*pxVar6->cur == '\n') {
      pxVar6->line = pxVar6->line + 1;
      pxVar6->col = 1;
    }
    else {
      pxVar6->col = pxVar6->col + 1;
    }
    pxVar6->cur = pxVar6->cur + local_170;
    val = xmlCurrentChar(ctxt,&local_170);
  } while( true );
}

Assistant:

void
xmlParseCharData(xmlParserCtxtPtr ctxt, int cdata) {
    const xmlChar *in;
    int nbchar = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;
    int ccol;
    DEBUG_CODE(
    const xmlChar *cur0 = ctxt->input->cur;
    );

    DEBUG_ENTER(("xmlParseCharData(%s, %d);\n", dbgCtxt(ctxt), cdata));

    SHRINK;
    GROW;
    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    if (ISXML && !cdata) {
	in = ctxt->input->cur;
	do {
get_more_space:
	    while (*in == 0x20) { in++; ctxt->input->col++; }
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more_space;
	    }
	    if (*in == '<') {
		nbchar = in - ctxt->input->cur;
		if (nbchar > 0) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if ((ctxt->sax != NULL) &&
		        (ctxt->sax->ignorableWhitespace !=
		         ctxt->sax->characters)) {
			if (areBlanks(ctxt, tmp, nbchar, 1)) {
			    if (ctxt->sax->ignorableWhitespace != NULL)
				ctxt->sax->ignorableWhitespace(ctxt->userData,
						       tmp, nbchar);
			} else {
			    if (ctxt->sax->characters != NULL)
				ctxt->sax->characters(ctxt->userData,
						      tmp, nbchar);
			    if (*ctxt->space == -1)
			        *ctxt->space = -2;
			}
		    } else if ((ctxt->sax != NULL) &&
		               (ctxt->sax->characters != NULL)) {
			ctxt->sax->characters(ctxt->userData,
					      tmp, nbchar);
		    }
		}
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }

get_more:
            ccol = ctxt->input->col;
	    while (test_char_data[*in]) {
		in++;
		ccol++;
	    }
	    ctxt->input->col = ccol;
	    if (*in == 0xA) {
		do {
		    ctxt->input->line++; ctxt->input->col = 1;
		    in++;
		} while (*in == 0xA);
		goto get_more;
	    }
	    if (*in == ']') {
		if ((in[1] == ']') && (in[2] == '>')) {
		    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
		    ctxt->input->cur = in + 1;
		    RETURN();
		}
		in++;
		ctxt->input->col++;
		goto get_more;
	    }
	    nbchar = in - ctxt->input->cur;
	    if (nbchar > 0) {
		if ((ctxt->sax != NULL) &&
		    (ctxt->sax->ignorableWhitespace !=
		     ctxt->sax->characters) &&
		    (IS_BLANK_CH(*ctxt->input->cur))) {
		    const xmlChar *tmp = ctxt->input->cur;
		    ctxt->input->cur = in;

		    if (areBlanks(ctxt, tmp, nbchar, 0)) {
		        if (ctxt->sax->ignorableWhitespace != NULL)
			    ctxt->sax->ignorableWhitespace(ctxt->userData,
							   tmp, nbchar);
		    } else {
		        if (ctxt->sax->characters != NULL)
			    ctxt->sax->characters(ctxt->userData,
						  tmp, nbchar);
			if (*ctxt->space == -1)
			    *ctxt->space = -2;
		    }
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		} else if (ctxt->sax != NULL) {
		    if (ctxt->sax->characters != NULL)
			ctxt->sax->characters(ctxt->userData,
					      ctxt->input->cur, nbchar);
                    line = ctxt->input->line;
                    col = ctxt->input->col;
		}
                /* something really bad happened in the SAX callback */
                if (ctxt->instate != XML_PARSER_CONTENT)
                    RETURN();
	    }
	    ctxt->input->cur = in;
	    if (*in == 0xD) {
		in++;
		if (*in == 0xA) {
		    ctxt->input->cur = in;
		    in++;
		    ctxt->input->line++; ctxt->input->col = 1;
		    continue; /* while */
		}
		in--;
	    }
	    if (*in == '<') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    if (*in == '&') {
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    }
	    SHRINK;
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF)
		RETURN_COMMENT(("chardata = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
	    in = ctxt->input->cur;
	} while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
	nbchar = 0;
    }
    ctxt->input->line = line;
    ctxt->input->col = col;
    xmlParseCharDataComplex(ctxt, cdata);
    /* In this complex case, the output text may be different from the parsed input string */
    RETURN_COMMENT(("parsed = %s;\n", dbgNStr(cur0, ctxt->input->cur - cur0)));
}